

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O2

AuthKbdInt * auth_kbdint_prompts(AuthPolicy *ap,ptrlen username)

{
  AuthKbdInt *pAVar1;
  char *pcVar2;
  AuthKbdIntPrompt *pAVar3;
  char *s;
  bool bVar4;
  
  if (ap->kbdint_state == 1) {
    pAVar1 = (AuthKbdInt *)safemalloc(1,0x20,0);
    pcVar2 = "Zero-prompt step";
    bVar4 = *(char *)(*(long *)(*(long *)&ap[1].kbdint_state + 0x10) + 0xbc) != '\0';
    if (bVar4) {
      pcVar2 = "";
    }
    s = "Shouldn\'t see any prompts this time";
    if (bVar4) {
      s = "";
    }
    pcVar2 = dupstr(pcVar2);
    pAVar1->title = pcVar2;
    pcVar2 = dupstr(s);
    pAVar1->instruction = pcVar2;
    pAVar1->nprompts = 0;
    pAVar1->prompts = (AuthKbdIntPrompt *)0x0;
  }
  else if (ap->kbdint_state == 0) {
    pAVar1 = (AuthKbdInt *)safemalloc(1,0x20,0);
    pcVar2 = dupstr("Initial double prompt");
    pAVar1->title = pcVar2;
    pcVar2 = dupstr("First prompt should echo, second should not");
    pAVar1->instruction = pcVar2;
    pAVar1->nprompts = 2;
    pAVar3 = (AuthKbdIntPrompt *)safemalloc(2,0x10,0);
    pAVar1->prompts = pAVar3;
    pcVar2 = dupstr("Echoey prompt: ");
    pAVar3 = pAVar1->prompts;
    pAVar3->prompt = pcVar2;
    pAVar3->echo = true;
    pcVar2 = dupstr("Silent prompt: ");
    pAVar3 = pAVar1->prompts;
    pAVar3[1].prompt = pcVar2;
    pAVar3[1].echo = false;
  }
  else {
    ap->kbdint_state = 0;
    pAVar1 = (AuthKbdInt *)0x0;
  }
  return pAVar1;
}

Assistant:

AuthKbdInt *auth_kbdint_prompts(AuthPolicy *ap, ptrlen username)
{
    AuthKbdInt *aki;

    switch (ap->kbdint_state) {
      case 0:
        aki = snew(AuthKbdInt);
        aki->title = dupstr("Initial double prompt");
        aki->instruction =
            dupstr("First prompt should echo, second should not");
        aki->nprompts = 2;
        aki->prompts = snewn(aki->nprompts, AuthKbdIntPrompt);
        aki->prompts[0].prompt = dupstr("Echoey prompt: ");
        aki->prompts[0].echo = true;
        aki->prompts[1].prompt = dupstr("Silent prompt: ");
        aki->prompts[1].echo = false;
        return aki;
      case 1: {
        struct server_instance *inst = container_of(
            ap, struct server_instance, ap);
        aki = snew(AuthKbdInt);
        if (inst->cfg->ssc->stunt_allow_trivial_ki_auth) {
            aki->title = dupstr("");
            aki->instruction = dupstr("");
        } else {
            aki->title = dupstr("Zero-prompt step");
            aki->instruction = dupstr("Shouldn't see any prompts this time");
        }
        aki->nprompts = 0;
        aki->prompts = NULL;
        return aki;
      }
      default:
        ap->kbdint_state = 0;
        return NULL;
    }
}